

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall
VarianceEstimator_VsClosedForm_Test::TestBody(VarianceEstimator_VsClosedForm_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  long lVar5;
  undefined1 *puVar6;
  uint uVar7;
  char *pcVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 in_XMM10_Da;
  undefined4 in_XMM10_Db;
  undefined8 in_XMM10_Qb;
  AssertionResult gtest_ar;
  Float err;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  float local_24;
  double local_20;
  double local_18;
  double local_10;
  
  local_10 = 0.0;
  lVar5 = 0;
  local_18 = 0.0;
  auVar9 = ZEXT816(0) << 0x40;
  puVar6 = &DAT_5851f42d4c957f2e;
  do {
    uVar7 = (uint)((ulong)puVar6 >> 0x2d) ^ (uint)((ulong)puVar6 >> 0x1b);
    bVar4 = (byte)((ulong)puVar6 >> 0x3b);
    auVar1._4_4_ = in_XMM10_Db;
    auVar1._0_4_ = in_XMM10_Da;
    auVar1._8_8_ = in_XMM10_Qb;
    auVar1 = vcvtusi2ss_avx512f(auVar1,uVar7 >> bVar4 | uVar7 << 0x20 - bVar4);
    auVar1 = vminss_avx(ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)),SUB6416(ZEXT464(0x3f7fffff),0)
                       );
    fVar13 = (auVar1._0_4_ + (float)(int)lVar5) / 10000.0;
    dVar14 = (double)(fVar13 - (1.0 - fVar13));
    lVar5 = lVar5 + 1;
    dVar10 = dVar14 - local_18;
    local_18 = local_18 + dVar10 / (double)lVar5;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar10;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar14 - local_18;
    auVar9 = vfmadd231sd_fma(auVar9,auVar15,auVar16);
    local_10 = local_10 + dVar14;
    puVar6 = (undefined1 *)((long)puVar6 * 0x5851f42d4c957f2d + 1);
  } while (lVar5 != 10000);
  local_20 = auVar9._0_8_ / 9999.0;
  auVar11._0_4_ = (float)(local_20 + -0.3333333333333333);
  auVar11._4_4_ = (int)((ulong)(local_20 + -0.3333333333333333) >> 0x20);
  auVar11._8_8_ = 0;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar11,auVar9);
  local_24 = auVar9._0_4_;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3f50624dd2f1a9fc;
  testing::internal::CmpHelperLT<float,double>(local_38,"err","1e-3",&local_24,(double *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    std::ostream::_M_insert<double>(local_20);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x3a8,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  dVar10 = (local_10 / 10000.0 - local_18) / (local_10 / 10000.0);
  auVar12._0_4_ = (float)dVar10;
  auVar12._4_4_ = (int)((ulong)dVar10 >> 0x20);
  auVar12._8_8_ = 0;
  auVar2._8_4_ = 0x7fffffff;
  auVar2._0_8_ = 0x7fffffff7fffffff;
  auVar2._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar12,auVar2);
  local_24 = auVar9._0_4_;
  local_48.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       &DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>(local_38,"err","1e-5",&local_24,(double *)&local_48);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x3ab,pcVar8);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_48.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_48.ptr_ + 8))();
      }
      local_48.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(VarianceEstimator, VsClosedForm) {
    VarianceEstimator<double> ve;
    int count = 10000;
    double sum = 0;
    for (Float u : Stratified1D(count)) {
        Float v = Lerp(u, -1, 1);
        ve.Add(v);
        sum += v;
    }

    // f(x) = 0, random variables x_i uniform in [-1,1] ->
    // variance is E[x^2] on [-1,1] == 1/3
    Float err = std::abs(ve.Variance() - 1. / 3.);
    EXPECT_LT(err, 1e-3) << ve.Variance();

    err = std::abs((sum / count - ve.Mean()) / (sum / count));
    EXPECT_LT(err, 1e-5);
}